

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDescriptor.cpp
# Opt level: O0

void normVector(vector<float,_std::allocator<float>_> *v)

{
  size_type sVar1;
  reference pvVar2;
  float fVar3;
  undefined4 local_1c;
  undefined4 local_18;
  int i_1;
  int i;
  float sum;
  vector<float,_std::allocator<float>_> *v_local;
  
  i_1 = 0;
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<float,_std::allocator<float>_>::size(v);
    if (sVar1 <= (ulong)(long)local_18) break;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](v,(long)local_18);
    fVar3 = *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](v,(long)local_18);
    i_1 = (int)(fVar3 * *pvVar2 + (float)i_1);
    local_18 = local_18 + 1;
  }
  fVar3 = sqrtf((float)i_1);
  local_1c = 0;
  while( true ) {
    sVar1 = std::vector<float,_std::allocator<float>_>::size(v);
    if (sVar1 <= (ulong)(long)local_1c) break;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](v,(long)local_1c);
    *pvVar2 = *pvVar2 / fVar3;
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void normVector(vector<float>& v) {
	float sum = 0.0F;
	for (int i = 0; i < v.size(); ++i) {
		sum += v[i] * v[i];
	}
	sum = sqrtf(sum);
	for (int i = 0; i < v.size(); ++i) {
		v[i] /= sum;
	}
}